

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputStatement.h
# Opt level: O0

void __thiscall InputStatement::execute(InputStatement *this,Environment *env)

{
  Scope scope;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  ThrowPacket *pTVar3;
  element_type *peVar4;
  element_type *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [8];
  string input;
  string local_a0;
  ptr<Value> local_80;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  ptr<Value> local_38;
  undefined1 local_28 [8];
  ptr<Symbol> symbol;
  Environment *env_local;
  InputStatement *this_local;
  
  symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)env;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->expression);
  if (bVar2) {
    std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)local_28);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    _Var1 = symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (!bVar2) {
      local_6d = 1;
      pTVar3 = (ThrowPacket *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Symbol not provided!",&local_59);
      ExceptionObjects::undefined_operation((ExceptionObjects *)&local_38,&local_58);
      ThrowPacket::ThrowPacket(pTVar3,&local_38);
      local_6d = 0;
      __cxa_throw(pTVar3,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
    }
    peVar4 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    bVar2 = Environment::hasSymbol((Environment *)_Var1._M_pi,&peVar4->name);
    if (!bVar2) {
      input.field_2._M_local_buf[0xe] = '\x01';
      pTVar3 = (ThrowPacket *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Symbol not defined!",
                 (allocator<char> *)(input.field_2._M_local_buf + 0xf));
      ExceptionObjects::undefined((ExceptionObjects *)&local_80,&local_a0);
      ThrowPacket::ThrowPacket(pTVar3,&local_80);
      input.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pTVar3,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
    }
    std::__cxx11::string::string(local_c8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_c8);
    _Var1 = symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    peVar4 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    peVar5 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    scope = peVar5->scope;
    make<String,std::__cxx11::string&>(&local_e8);
    std::shared_ptr<Value>::shared_ptr<String,void>
              ((shared_ptr<Value> *)&local_e8.field_2,(shared_ptr<String> *)&local_e8);
    peVar5 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    Environment::putValue
              ((Environment *)_Var1._M_pi,&peVar4->name,scope,(ptr<Value> *)&local_e8.field_2,
               (bool)(peVar5->constant & 1));
    std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)&local_e8.field_2);
    std::shared_ptr<String>::~shared_ptr((shared_ptr<String> *)&local_e8);
    std::__cxx11::string::~string(local_c8);
    std::shared_ptr<Symbol>::~shared_ptr((shared_ptr<Symbol> *)local_28);
  }
  return;
}

Assistant:

void execute(Environment *env) override {
        if(!expression)
            return;

        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(expression);

        if(!symbol)
            throw ThrowPacket(ExceptionObjects::undefined_operation("Symbol not provided!"));

        if(!env->hasSymbol(symbol -> name))
            throw ThrowPacket(ExceptionObjects::undefined("Symbol not defined!"));

        std::string input;
        std::getline(std::cin, input);

        env->putValue(symbol->name, symbol->scope, make<String>(input), symbol->constant);
    }